

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_gc.c
# Opt level: O2

void zt_gc_destroy(zt_gc_t *gc)

{
  zt_elist *pzVar1;
  zt_elist *pzVar2;
  zt_elist_t *pzVar3;
  
  if (gc->enabled != 0) {
    puts("# Warning: destroying gc while gc is disabled");
    gc->enabled = 0;
  }
  zt_gc_collect(gc,1);
  pzVar3 = gc->white;
  zt_gc_destroy::elt = pzVar3->next;
  while (zt_gc_destroy::elt != pzVar3) {
    pzVar1 = zt_gc_destroy::elt->prev;
    pzVar2 = zt_gc_destroy::elt->next;
    pzVar2->prev = pzVar1;
    pzVar1->next = pzVar2;
    (*gc->release_fn)(gc,gc->private_data,&zt_gc_destroy::elt);
    zt_gc_destroy::elt = pzVar2;
    pzVar3 = gc->white;
  }
  pzVar3 = gc->grey;
  zt_gc_destroy::elt = pzVar3->next;
  while (zt_gc_destroy::elt != pzVar3) {
    pzVar1 = zt_gc_destroy::elt->prev;
    pzVar2 = zt_gc_destroy::elt->next;
    pzVar2->prev = pzVar1;
    pzVar1->next = pzVar2;
    (*gc->release_fn)(gc,gc->private_data,&zt_gc_destroy::elt);
    zt_gc_destroy::elt = pzVar2;
    pzVar3 = gc->grey;
  }
  pzVar3 = gc->black;
  zt_gc_destroy::elt = pzVar3->next;
  while (zt_gc_destroy::elt != pzVar3) {
    pzVar1 = zt_gc_destroy::elt->prev;
    pzVar2 = zt_gc_destroy::elt->next;
    pzVar2->prev = pzVar1;
    pzVar1->next = pzVar2;
    (*gc->release_fn)(gc,gc->private_data,&zt_gc_destroy::elt);
    zt_gc_destroy::elt = pzVar2;
    pzVar3 = gc->black;
  }
  gc->enabled = 1;
  return;
}

Assistant:

void
zt_gc_destroy(zt_gc_t *gc)
{
    static zt_elist_t * elt;
    zt_elist_t * dont_use;

    if (gc->enabled != 0) {
        printf("# Warning: destroying gc while gc is disabled\n");
        gc->enabled = 0;
    }

    zt_gc_collect(gc, TRUE);

    zt_elist_for_each_safe(gc->white, elt, dont_use) {
        zt_elist_remove(elt);
        gc->release_fn(gc, gc->private_data, (void **)&elt);
    }

    zt_elist_for_each_safe(gc->grey, elt, dont_use) {
        zt_elist_remove(elt);
        gc->release_fn(gc, gc->private_data, (void **)&elt);
    }

    zt_elist_for_each_safe(gc->black, elt, dont_use) {
        zt_elist_remove(elt);
        gc->release_fn(gc, gc->private_data, (void **)&elt);
    }

    gc->enabled = 1;
}